

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O3

void nn_surveyor_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  nn_surveyor *self_00;
  int *piVar1;
  
  self_00 = (nn_surveyor *)&self[-5].shutdown_fn;
  if (self == (nn_fsm *)0x0) {
    self_00 = (nn_surveyor *)0x0;
  }
  piVar1 = &self_00->state;
  switch(self_00->state) {
  case 1:
    if (src != -2) {
      nn_surveyor_handler_cold_12();
LAB_001a0e8e:
      nn_surveyor_handler_cold_10();
      goto switchD_001a0d88_default;
    }
    if (type == -2) goto LAB_001a0e2b;
    src = type;
    nn_surveyor_handler_cold_13();
    type = extraout_EDX;
  case 5:
    if (src == 1) {
LAB_001a0e22:
      if (type == 2) {
LAB_001a0e2b:
        *piVar1 = 2;
        return;
      }
    }
    else {
      if (src == -2) {
        if (type == 2) {
          *piVar1 = 4;
          return;
        }
      }
      else {
LAB_001a0e98:
        nn_surveyor_handler_cold_3();
LAB_001a0e9d:
        nn_surveyor_handler_cold_9();
LAB_001a0ea2:
        nn_surveyor_handler_cold_6();
      }
      nn_surveyor_handler_cold_2();
    }
    nn_surveyor_handler_cold_1();
LAB_001a0eb5:
    nn_surveyor_handler_cold_8();
    break;
  case 2:
switchD_001a0d88_caseD_2:
    if (src != -2) goto LAB_001a0e8e;
    if (type == 1) {
LAB_001a0e63:
      nn_surveyor_resend(self_00);
      nn_timer_start(&self_00->timer,self_00->deadline);
      self_00->state = 3;
      return;
    }
    nn_surveyor_handler_cold_11();
    type = extraout_EDX_01;
    goto LAB_001a0e22;
  case 3:
    if (src != 1) {
      if (src != -2) goto LAB_001a0e9d;
      if (type == 2) {
        nn_timer_stop(&self_00->timer);
        self_00->state = 4;
        return;
      }
      goto LAB_001a0eb5;
    }
    if (type == 1) {
      nn_timer_stop(&self_00->timer);
      self_00->state = 5;
      self_00->timedout = 1;
      return;
    }
    break;
  case 4:
    if (src == 1) {
      if (type == 2) goto LAB_001a0e63;
      goto LAB_001a0ec3;
    }
    if (src == -2) {
      if (type == 2) {
        return;
      }
      src = type;
      nn_surveyor_handler_cold_5();
      type = extraout_EDX_00;
      goto switchD_001a0d88_caseD_2;
    }
    goto LAB_001a0ea2;
  default:
switchD_001a0d88_default:
    nn_surveyor_handler_cold_14();
    goto LAB_001a0e98;
  }
  nn_surveyor_handler_cold_7();
LAB_001a0ec3:
  nn_surveyor_handler_cold_4();
}

Assistant:

static void nn_surveyor_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, fsm);

    switch (surveyor->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The socket was created recently.                                          */
/******************************************************************************/
    case NN_SURVEYOR_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                surveyor->state = NN_SURVEYOR_STATE_PASSIVE;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  PASSIVE state.                                                            */
/*  There's no survey going on.                                               */
/******************************************************************************/
    case NN_SURVEYOR_STATE_PASSIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_START:
                nn_surveyor_resend (surveyor);
                nn_timer_start (&surveyor->timer, surveyor->deadline);
                surveyor->state = NN_SURVEYOR_STATE_ACTIVE;
                return;

            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  Survey was sent, waiting for responses.                                   */
/******************************************************************************/
    case NN_SURVEYOR_STATE_ACTIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_CANCEL:
                nn_timer_stop (&surveyor->timer);
                surveyor->state = NN_SURVEYOR_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        case NN_SURVEYOR_SRC_DEADLINE_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&surveyor->timer);
                surveyor->state = NN_SURVEYOR_STATE_STOPPING_TIMER;
                surveyor->timedout = NN_SURVEYOR_TIMEDOUT;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  CANCELLING state.                                                         */
/*  Survey was cancelled, but the old timer haven't stopped yet. The new      */
/*  survey thus haven't been sent and is stored in 'tosend'.                  */
/******************************************************************************/
    case NN_SURVEYOR_STATE_CANCELLING:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_CANCEL:
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        case NN_SURVEYOR_SRC_DEADLINE_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_surveyor_resend (surveyor);
                nn_timer_start (&surveyor->timer, surveyor->deadline);
                surveyor->state = NN_SURVEYOR_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER state.                                                     */
/*  Survey timeout expired. Now we are stopping the timer.                    */
/******************************************************************************/
    case NN_SURVEYOR_STATE_STOPPING_TIMER:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SURVEYOR_ACTION_CANCEL:
                surveyor->state = NN_SURVEYOR_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        case NN_SURVEYOR_SRC_DEADLINE_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                surveyor->state = NN_SURVEYOR_STATE_PASSIVE;
                return;
            default:
                nn_fsm_bad_action (surveyor->state, src, type);
            }

        default:
            nn_fsm_bad_source (surveyor->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (surveyor->state, src, type);
    }
}